

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O3

int run_test_getaddrinfo_fail_sync(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  undefined4 *puVar3;
  addrinfo *ai;
  addrinfo *ai_00;
  long extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_getaddrinfo_t *req_00;
  uv_loop_t *puVar4;
  uv_handle_t *handle;
  int *piVar5;
  long lVar6;
  uv_getaddrinfo_t req;
  uv_getaddrinfo_t uStack_160;
  uv_loop_t *puStack_c0;
  uv_loop_t *puStack_b8;
  uv_loop_t *puStack_b0;
  uv_getaddrinfo_t uStack_a8;
  
  puStack_b0 = (uv_loop_t *)0x158dc6;
  puVar2 = uv_default_loop();
  puStack_b0 = (uv_loop_t *)0x158de0;
  iVar1 = uv_getaddrinfo(puVar2,&uStack_a8,(uv_getaddrinfo_cb)0x0,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar1 < 0) {
    puStack_b0 = (uv_loop_t *)0x158df1;
    uv_freeaddrinfo(uStack_a8.addrinfo);
    puStack_b0 = (uv_loop_t *)0x158df6;
    unaff_RBX = uv_default_loop();
    puStack_b0 = (uv_loop_t *)0x158e0a;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_b0 = (uv_loop_t *)0x158e14;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_b0 = (uv_loop_t *)0x158e19;
    puVar2 = uv_default_loop();
    puStack_b0 = (uv_loop_t *)0x158e21;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_b0 = (uv_loop_t *)0x158e35;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  puStack_b0 = (uv_loop_t *)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  puStack_b8 = (uv_loop_t *)0x158e45;
  puStack_b0 = unaff_RBX;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  puStack_b8 = (uv_loop_t *)0x158e51;
  puVar2 = uv_default_loop();
  puStack_b8 = (uv_loop_t *)0x158e74;
  iVar1 = uv_getaddrinfo(puVar2,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar1 == 0) {
    puStack_b8 = (uv_loop_t *)0x158e7d;
    puVar2 = uv_default_loop();
    puStack_b8 = (uv_loop_t *)0x158e87;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (getaddrinfo_cbs != 1) goto LAB_00158ecd;
    puStack_b8 = (uv_loop_t *)0x158e95;
    unaff_RBX = uv_default_loop();
    puStack_b8 = (uv_loop_t *)0x158ea9;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_b8 = (uv_loop_t *)0x158eb3;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_b8 = (uv_loop_t *)0x158eb8;
    puVar2 = uv_default_loop();
    puStack_b8 = (uv_loop_t *)0x158ec0;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_b8 = (uv_loop_t *)0x158ecd;
    run_test_getaddrinfo_basic_cold_1();
LAB_00158ecd:
    puStack_b8 = (uv_loop_t *)0x158ed2;
    run_test_getaddrinfo_basic_cold_2();
  }
  puStack_b8 = (uv_loop_t *)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  puStack_b8 = unaff_RBX;
  if ((uv_loop_t *)getaddrinfo_handle == puVar2) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    puStack_c0 = (uv_loop_t *)0x158eef;
    free(puVar2);
    uv_freeaddrinfo(ai);
    return extraout_EAX;
  }
  puStack_c0 = (uv_loop_t *)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  puStack_c0 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,&uStack_160,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_160.addrinfo);
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  req_00 = getaddrinfo_handles;
  piVar5 = callback_counts;
  lVar6 = 0;
  do {
    *piVar5 = 0;
    puVar2 = (uv_loop_t *)0x4;
    puVar3 = (undefined4 *)malloc(4);
    if (puVar3 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015906c:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_00159071;
    }
    *puVar3 = (int)lVar6;
    req_00->data = puVar3;
    puVar2 = uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar2,req_00,getaddrinfo_cuncurrent_cb,"localhost",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar1 != 0) goto LAB_0015906c;
    lVar6 = lVar6 + 1;
    req_00 = req_00 + 1;
    piVar5 = piVar5 + 1;
  } while (lVar6 != 10);
  puVar2 = uv_default_loop();
  lVar6 = 0;
  uv_run(puVar2,UV_RUN_DEFAULT);
  do {
    if (*(int *)((long)callback_counts + lVar6) != 1) goto LAB_00159071;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x28);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
LAB_00159076:
  run_test_getaddrinfo_concurrent_cold_3();
  handle = (uv_handle_t *)puVar2->data;
  piVar5 = callback_counts;
  puVar4 = (uv_loop_t *)&closedir_req.bufsml[1].len;
  lVar6 = 0;
  do {
    puVar4 = (uv_loop_t *)((puVar4->wq_mutex).__size + 0x18);
    if (puVar4 == puVar2) goto LAB_001590b3;
    piVar5 = piVar5 + 1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar6 = extraout_RDX;
LAB_001590b3:
  if (*(int *)&handle->data == (int)lVar6) {
    *piVar5 = *piVar5 + 1;
    free(handle);
    uv_freeaddrinfo(ai_00);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return extraout_EAX_00;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_01;
LAB_00159071:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_00159076;
}

Assistant:

TEST_IMPL(getaddrinfo_fail_sync) {
  uv_getaddrinfo_t req;

  /* Use a FQDN by ending in a period */
  ASSERT(0 > uv_getaddrinfo(uv_default_loop(),
                            &req,
                            NULL,
                            "xyzzy.xyzzy.xyzzy.",
                            NULL,
                            NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY();
  return 0;
}